

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

void deqp::WriteField(TestLog *log,char *title,string *message)

{
  bool bVar1;
  istream *piVar2;
  char *msgStr;
  string local_1c0 [8];
  string line;
  istringstream tokens;
  string *message_local;
  char *title_local;
  TestLog *log_local;
  
  bVar1 = std::operator==(message,"");
  if (!bVar1) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(line.field_2._M_local_buf + 8),(string *)message,_S_in);
    std::__cxx11::string::string(local_1c0);
    tcu::TestLog::startSection(log,"Details",title);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),local_1c0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      msgStr = (char *)std::__cxx11::string::c_str();
      tcu::TestLog::writeMessage(log,msgStr);
    }
    tcu::TestLog::endSection(log);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void WriteField(tcu::TestLog& log, const char* title, std::string message)
{
	if (message == "")
		return;
	using namespace std;
	using tcu::TestLog;
	istringstream tokens(message);
	string		  line;
	log.startSection("Details", title);
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}